

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer.cpp
# Opt level: O2

void __thiscall
VGMPlayer::RefreshDevOptions(VGMPlayer *this,CHIP_DEVICE *chipDev,PLR_DEV_OPTS *devOpts)

{
  UINT8 UVar1;
  DEVFUNC_OPTMASK UNRECOVERED_JUMPTABLE;
  uint uVar2;
  uint uVar3;
  DEV_INFO *devInf;
  
  UNRECOVERED_JUMPTABLE = ((chipDev->base).defInf.devDef)->SetOptionBits;
  if (UNRECOVERED_JUMPTABLE != (DEVFUNC_OPTMASK)0x0) {
    UVar1 = chipDev->chipType;
    uVar3 = devOpts->coreOpts;
    if (UVar1 == '\x1f') {
      uVar3 = uVar3 | 1;
    }
    else if (UVar1 == '\x13') {
      uVar3 = uVar3 | 0x80;
    }
    else if (UVar1 == '\x02') {
      uVar2 = uVar3 & 0xffffffcf | 0x10;
      if (chipDev->flags == 0) {
        uVar2 = uVar3;
      }
      uVar3 = (byte)(this->_p2612Fix << 7) | uVar2;
    }
    (*UNRECOVERED_JUMPTABLE)((chipDev->base).defInf.dataPtr,uVar3);
    return;
  }
  return;
}

Assistant:

void VGMPlayer::RefreshDevOptions(CHIP_DEVICE& chipDev, const PLR_DEV_OPTS& devOpts)
{
	UINT8 chipType = chipDev.chipType;
	DEV_INFO* devInf = &chipDev.base.defInf;
	if (devInf->devDef->SetOptionBits == NULL)
		return;
	
	UINT32 coreOpts = devOpts.coreOpts;
	if (chipType == DEVID_YM2612)
	{
		if (chipDev.flags)
			coreOpts = (coreOpts & ~0x30) | OPT_YM2612_TYPE_OPN2C_ASIC;	// enforce YM3438 mode
		if (_p2612Fix & P2612FIX_ACTIVE)
			coreOpts |= OPT_YM2612_LEGACY_MODE;	// enable legacy mode
	}
	else if (chipType == DEVID_GB_DMG)
		coreOpts |= OPT_GB_DMG_LEGACY_MODE;	// enable legacy mode (fix playback of old VGMs)
	else if (chipType == DEVID_QSOUND)
		coreOpts |= OPT_QSOUND_NOWAIT;	// make sure seeking works
	
	devInf->devDef->SetOptionBits(devInf->dataPtr, coreOpts);
	return;
}